

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

tests * lest::make_tests<lest::test[5]>(tests *__return_storage_ptr__,test (*c) [5])

{
  tests tStack_28;
  
  make_tests(&tStack_28,*c,c[1]);
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(__return_storage_ptr__,&tStack_28);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&tStack_28);
  return __return_storage_ptr__;
}

Assistant:

tests make_tests( C const & c ) { return make_tests( test_begin( c ), test_end( c ) ); }